

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

string * __thiscall
duckdb::Exception::ConstructMessageRecursive<signed_char,unsigned_char,unsigned_char>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
          *values,char param,uchar params,uchar params_1)

{
  uchar params_00;
  ExceptionFormatValue EStack_68;
  
  params_00 = params;
  duckdb::ExceptionFormatValue::ExceptionFormatValue(&EStack_68,(long)(int)values);
  std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  emplace_back<duckdb::ExceptionFormatValue>
            ((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             msg,&EStack_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)EStack_68.str_val._M_dataplus._M_p != &EStack_68.str_val.field_2) {
    operator_delete(EStack_68.str_val._M_dataplus._M_p);
  }
  ConstructMessageRecursive<unsigned_char,unsigned_char>
            ((string *)__return_storage_ptr__,this,(string *)msg,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             (ulong)(byte)param,params,params_00);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}